

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *other)

{
  MemberInfo **ppMVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar2;
  MemberInfo **ppMVar3;
  ArrayDisposer *pAVar4;
  
  ppMVar1 = this->ptr;
  if (ppMVar1 != (MemberInfo **)0x0) {
    ppMVar2 = this->pos;
    ppMVar3 = this->endPtr;
    this->ptr = (MemberInfo **)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
    this->endPtr = (MemberInfo **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppMVar1,8,(long)ppMVar2 - (long)ppMVar1 >> 3,
               (long)ppMVar3 - (long)ppMVar1 >> 3,0);
  }
  ppMVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppMVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (MemberInfo **)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
  other->endPtr = (MemberInfo **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }